

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

ps_latlink_t * ps_lattice_traverse_edges(ps_lattice_t *dag,ps_latnode_t *start,ps_latnode_t *end)

{
  anon_union_8_4_397b8dde_for_info *paVar1;
  ps_latnode_t *ppVar2;
  latlink_list_t *plVar3;
  ps_latnode_t **pppVar4;
  ps_latlink_t *ppVar5;
  ps_latnode_t **pppVar6;
  latlink_list_t **pplVar7;
  
  ps_lattice_delq(dag);
  pppVar4 = &dag->nodes;
  pppVar6 = pppVar4;
  while (ppVar2 = *pppVar6, ppVar2 != (ps_latnode_t *)0x0) {
    (ppVar2->info).fanin = 0;
    pppVar6 = &ppVar2->next;
  }
  while (ppVar2 = *pppVar4, ppVar2 != (ps_latnode_t *)0x0) {
    pplVar7 = &ppVar2->exits;
    while (plVar3 = *pplVar7, plVar3 != (latlink_list_t *)0x0) {
      paVar1 = &plVar3->link->to->info;
      paVar1->fanin = paVar1->fanin + 1;
      pplVar7 = &plVar3->next;
    }
    pppVar4 = &ppVar2->next;
  }
  if (start == (ps_latnode_t *)0x0) {
    start = dag->start;
  }
  pplVar7 = &start->exits;
  while (plVar3 = *pplVar7, plVar3 != (latlink_list_t *)0x0) {
    ps_lattice_pushq(dag,plVar3->link);
    pplVar7 = &plVar3->next;
  }
  ppVar5 = ps_lattice_traverse_next(dag,end);
  return ppVar5;
}

Assistant:

ps_latlink_t *
ps_lattice_traverse_edges(ps_lattice_t *dag, ps_latnode_t *start, ps_latnode_t *end)
{
    ps_latnode_t *node;
    latlink_list_t *x;

    /* Cancel any unfinished traversal. */
    ps_lattice_delq(dag);

    /* Initialize node fanin counts and path scores. */
    for (node = dag->nodes; node; node = node->next)
        node->info.fanin = 0;
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next)
            (x->link->to->info.fanin)++;
    }

    /* Initialize agenda with all exits from start. */
    if (start == NULL) start = dag->start;
    for (x = start->exits; x; x = x->next)
        ps_lattice_pushq(dag, x->link);

    /* Pull the first edge off the queue. */
    return ps_lattice_traverse_next(dag, end);
}